

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O3

void __thiscall
TPZSubMeshAnalysis::SetCompMesh
          (TPZSubMeshAnalysis *this,TPZCompMesh *mesh,bool mustOptimizeBandwidth)

{
  TPZCompMesh *this_00;
  double *pdVar1;
  TPZSubCompMesh *pTVar2;
  ulong uVar3;
  double *pdVar4;
  
  if (mesh != (TPZCompMesh *)0x0) {
    pTVar2 = (TPZSubCompMesh *)
             __dynamic_cast(mesh,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0);
    if (pTVar2 != (TPZSubCompMesh *)0x0) {
      this->fMesh = pTVar2;
      TPZAnalysis::SetCompMesh((TPZAnalysis *)this,mesh,mustOptimizeBandwidth);
      this_00 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh;
      if (this_00 != (TPZCompMesh *)0x0) {
        uVar3 = TPZCompMesh::NEquations(this_00);
        if (uVar3 != (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol *
                     (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) {
          pdVar1 = (this->fReferenceSolution).fElem;
          pdVar4 = (this->fReferenceSolution).fGiven;
          if (pdVar1 != pdVar4 && pdVar1 != (double *)0x0) {
            operator_delete__(pdVar1);
            pdVar4 = (this->fReferenceSolution).fGiven;
          }
          if ((pdVar4 == (double *)0x0) || ((this->fReferenceSolution).fSize < (long)uVar3)) {
            if (uVar3 == 0) {
              pdVar4 = (double *)0x0;
            }
            else {
              pdVar4 = (double *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 << 3);
            }
          }
          (this->fReferenceSolution).fElem = pdVar4;
        }
        (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar3;
        (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
        (*(this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0xf])(&this->fReferenceSolution);
        return;
      }
      return;
    }
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/pzsmanal.cpp"
             ,0x2d);
}

Assistant:

void TPZSubMeshAnalysis::SetCompMesh(TPZCompMesh * mesh, bool mustOptimizeBandwidth)
{
    TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(mesh);
    if (submesh) {
        fMesh = submesh;
    }
    else
    {
        DebugStop();
    }
    TPZLinearAnalysis::SetCompMesh(mesh, mustOptimizeBandwidth);
    if (fCompMesh) {
        fReferenceSolution.Redim(fCompMesh->NEquations(), 1);
    }
}